

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cc
# Opt level: O3

int __thiscall
tchecker::assign_statement_t::clone
          (assign_statement_t *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  undefined4 extraout_var;
  assign_statement_t *this_00;
  shared_ptr<const_tchecker::expression_t> rvalue_clone;
  shared_ptr<const_tchecker::lvalue_expression_t> lvalue_clone;
  shared_ptr<const_tchecker::expression_t> local_30;
  shared_ptr<const_tchecker::lvalue_expression_t> local_20;
  
  local_20.super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           (**(code **)((long)*(this->_lvalue).
                               super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + 0x28))();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tchecker::lvalue_expression_t*>
            (&local_20.
              super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             local_20.
             super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  iVar1 = (*((this->_rvalue).
             super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_expression_t[2])();
  local_30.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)CONCAT44(extraout_var,iVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tchecker::expression_t*>
            (&local_30.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             local_30.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  this_00 = (assign_statement_t *)operator_new(0x28);
  assign_statement_t(this_00,&local_20,&local_30);
  if (local_30.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_20.super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.
               super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return (int)this_00;
}

Assistant:

tchecker::assign_statement_t * assign_statement_t::clone() const
{
  std::shared_ptr<tchecker::lvalue_expression_t const> lvalue_clone{_lvalue->clone()};
  std::shared_ptr<tchecker::expression_t const> rvalue_clone{_rvalue->clone()};
  return new tchecker::assign_statement_t(lvalue_clone, rvalue_clone);
}